

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O1

bool CheckShader(GLuint handle,char *desc)

{
  uint uVar1;
  uint uVar2;
  undefined1 uVar3;
  undefined1 extraout_AL;
  int iVar4;
  ImGuiContext *pIVar5;
  ImGuiIO *pIVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar7;
  void *pvVar8;
  ImVector<char> buf;
  GLint log_length;
  GLint status;
  void *pvStack_40;
  uint local_38;
  undefined4 local_34;
  
  pIVar5 = ImGui::GetCurrentContext();
  if (pIVar5 == (ImGuiContext *)0x0) {
    pvVar8 = (void *)0x0;
  }
  else {
    pIVar6 = ImGui::GetIO();
    pvVar8 = pIVar6->BackendRendererUserData;
  }
  local_34 = 0;
  local_38 = 0;
  (*imgl3wProcs.ptr[0x24])(handle,0x8b81,&local_34);
  uVar3 = (*imgl3wProcs.ptr[0x24])(handle,0x8b84,&local_38);
  if ((char)local_34 == '\0') {
    iVar4 = fprintf(_stderr,
                    "ERROR: ImGui_ImplOpenGL3_CreateDeviceObjects: failed to compile %s! With GLSL: %s\n"
                    ,desc,(long)pvVar8 + 4);
    uVar3 = (undefined1)iVar4;
  }
  if (1 < (int)local_38) {
    pvStack_40 = (void *)0x0;
    uVar1 = local_38 + 1;
    uVar2 = 0;
    if (-1 < (int)local_38) {
      uVar7 = 8;
      if (7 < (int)uVar1) {
        uVar7 = uVar1;
      }
      if (0 < (int)uVar7) {
        pvStack_40 = ImGui::MemAlloc((ulong)uVar7);
        uVar2 = uVar7;
      }
    }
    (*imgl3wProcs.ptr[0x23])(handle,(ulong)local_38,0,pvStack_40,in_R8,in_R9,CONCAT44(uVar2,uVar1));
    iVar4 = fprintf(_stderr,"%s\n",pvStack_40);
    uVar3 = (undefined1)iVar4;
    if (pvStack_40 != (void *)0x0) {
      ImGui::MemFree(pvStack_40);
      uVar3 = extraout_AL;
    }
  }
  return (bool)uVar3;
}

Assistant:

static bool CheckShader(GLuint handle, const char* desc)
{
    ImGui_ImplOpenGL3_Data* bd = ImGui_ImplOpenGL3_GetBackendData();
    GLint status = 0, log_length = 0;
    glGetShaderiv(handle, GL_COMPILE_STATUS, &status);
    glGetShaderiv(handle, GL_INFO_LOG_LENGTH, &log_length);
    if ((GLboolean)status == GL_FALSE)
        fprintf(stderr, "ERROR: ImGui_ImplOpenGL3_CreateDeviceObjects: failed to compile %s! With GLSL: %s\n", desc, bd->GlslVersionString);
    if (log_length > 1)
    {
        ImVector<char> buf;
        buf.resize((int)(log_length + 1));
        glGetShaderInfoLog(handle, log_length, NULL, (GLchar*)buf.begin());
        fprintf(stderr, "%s\n", buf.begin());
    }
    return (GLboolean)status == GL_TRUE;
}